

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int_mv get_ref_mv_from_stack
                 (int ref_idx,MV_REFERENCE_FRAME *ref_frame,int ref_mv_idx,
                 MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame)

{
  int8_t iVar1;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  CANDIDATE_MV *curr_ref_mv_stack;
  int8_t ref_frame_type;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  iVar1 = av1_ref_frame_type(in_stack_ffffffffffffffc8);
  if (*(char *)(in_RSI + 1) < '\x01') {
    if (in_EDX < (int)(uint)*(byte *)(in_RCX + 0x28)) {
      local_4 = *(int_mv *)(in_RCX + (long)in_EDX * 8);
    }
    else {
      local_4 = *(int_mv *)(in_RCX + 0x2c + (long)iVar1 * 4);
    }
  }
  else if (in_EDI == 0) {
    local_4 = *(int_mv *)(in_RCX + (long)in_EDX * 8);
  }
  else {
    local_4 = *(int_mv *)(in_RCX + 4 + (long)in_EDX * 8);
  }
  return (int_mv)local_4.as_int;
}

Assistant:

static inline int_mv get_ref_mv_from_stack(
    int ref_idx, const MV_REFERENCE_FRAME *ref_frame, int ref_mv_idx,
    const MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame) {
  const int8_t ref_frame_type = av1_ref_frame_type(ref_frame);
  const CANDIDATE_MV *curr_ref_mv_stack = mbmi_ext_frame->ref_mv_stack;

  if (ref_frame[1] > INTRA_FRAME) {
    assert(ref_idx == 0 || ref_idx == 1);
    return ref_idx ? curr_ref_mv_stack[ref_mv_idx].comp_mv
                   : curr_ref_mv_stack[ref_mv_idx].this_mv;
  }

  assert(ref_idx == 0);
  return ref_mv_idx < mbmi_ext_frame->ref_mv_count
             ? curr_ref_mv_stack[ref_mv_idx].this_mv
             : mbmi_ext_frame->global_mvs[ref_frame_type];
}